

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void add_ability(artifact *art,int32_t target_power,int *freq,artifact_set_data *data)

{
  wchar_t r_00;
  wchar_t r;
  artifact_set_data *data_local;
  int *freq_local;
  int32_t target_power_local;
  artifact *art_local;
  
  r_00 = choose_ability(freq);
  add_ability_aux(art,r_00,target_power,data);
  remove_contradictory(art);
  if ((art->modifiers[2] != 0) && ((art->tval == 9 || (art->tval == 8)))) {
    add_flag(art,L'\x12');
  }
  return;
}

Assistant:

static void add_ability(struct artifact *art, int32_t target_power, int *freq,
						struct artifact_set_data *data)
{
	int r;

	/* Choose a random ability using the frequency table previously defined */
	r = choose_ability(freq);

	/* Add the appropriate ability */
	add_ability_aux(art, r, target_power, data);

	/* Now remove contradictory or redundant powers. */
	remove_contradictory(art);

	/* Adding WIS to sharp weapons always blesses them */
	if (art->modifiers[OBJ_MOD_WIS] &&
		(art->tval == TV_SWORD || art->tval == TV_POLEARM))
		add_flag(art, OF_BLESSED);
}